

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

color_t __thiscall Image::Get(Image *this,int x,int y)

{
  undefined1 uVar1;
  undefined1 uVar2;
  pointer pcVar3;
  long lVar4;
  void *pvVar5;
  color_t cVar6;
  undefined8 uVar7;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  
  uVar9 = (ulong)(y * this->width_ + x);
  pcVar3 = (this->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pcVar3) * -0x5555555555555555;
  if (uVar9 <= uVar8 && uVar8 - uVar9 != 0) {
    uVar1 = pcVar3[uVar9].r;
    uVar2 = pcVar3[uVar9].g;
    cVar6.g = uVar2;
    cVar6.r = uVar1;
    cVar6.b = pcVar3[uVar9].b;
    return cVar6;
  }
  pcVar10 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  uVar7 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  lVar4 = *(long *)((long)pcVar10 + 8);
  for (lVar11 = *(long *)pcVar10; lVar11 != lVar4; lVar11 = lVar11 + 0x20) {
    pvVar5 = *(void **)(lVar11 + 8);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,*(long *)(lVar11 + 0x18) - (long)pvVar5);
      uVar7 = extraout_RAX;
    }
  }
  pvVar5 = *(void **)pcVar10;
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,*(long *)((long)pcVar10 + 0x10) - (long)pvVar5);
    return SUB83(extraout_RAX_00,0);
  }
  return SUB83(uVar7,0);
}

Assistant:

color_t Get(int x, int y) const { return pixels_.at(y * width_ + x); }